

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_factory.cpp
# Opt level: O0

void bidfx_public_api::tools::LoggerFactory::SetLogLevel(level_enum level)

{
  bool bVar1;
  reference psVar2;
  element_type *this;
  undefined1 local_38 [8];
  shared_ptr<spdlog::logger> logger;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<spdlog::logger>,_std::less<std::shared_ptr<spdlog::logger>_>,_std::allocator<std::shared_ptr<spdlog::logger>_>_>
  *__range2;
  level_enum level_local;
  
  level_ = level;
  __end2 = std::
           set<std::shared_ptr<spdlog::logger>,_std::less<std::shared_ptr<spdlog::logger>_>,_std::allocator<std::shared_ptr<spdlog::logger>_>_>
           ::begin((set<std::shared_ptr<spdlog::logger>,_std::less<std::shared_ptr<spdlog::logger>_>,_std::allocator<std::shared_ptr<spdlog::logger>_>_>
                    *)loggers_);
  logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       set<std::shared_ptr<spdlog::logger>,_std::less<std::shared_ptr<spdlog::logger>_>,_std::allocator<std::shared_ptr<spdlog::logger>_>_>
       ::end((set<std::shared_ptr<spdlog::logger>,_std::less<std::shared_ptr<spdlog::logger>_>,_std::allocator<std::shared_ptr<spdlog::logger>_>_>
              *)loggers_);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&logger.
                                              super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
    if (!bVar1) break;
    psVar2 = std::_Rb_tree_const_iterator<std::shared_ptr<spdlog::logger>_>::operator*(&__end2);
    std::shared_ptr<spdlog::logger>::shared_ptr((shared_ptr<spdlog::logger> *)local_38,psVar2);
    this = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_38);
    spdlog::logger::set_level(this,level);
    std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)local_38);
    std::_Rb_tree_const_iterator<std::shared_ptr<spdlog::logger>_>::operator++(&__end2);
  }
  return;
}

Assistant:

void LoggerFactory::SetLogLevel(spdlog::level::level_enum level)
{
    level_ = level;
    for(auto logger : loggers_)
    {
        logger->set_level(level);
    }
}